

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O2

void __thiscall
BanMan::Ban(BanMan *this,CNetAddr *net_addr,int64_t ban_time_offset,bool since_unix_epoch)

{
  long in_FS_OFFSET;
  CSubNet sub_net;
  CSubNet local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CSubNet::CSubNet(&local_60,net_addr);
  Ban(this,&local_60,ban_time_offset,since_unix_epoch);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::Ban(const CNetAddr& net_addr, int64_t ban_time_offset, bool since_unix_epoch)
{
    CSubNet sub_net(net_addr);
    Ban(sub_net, ban_time_offset, since_unix_epoch);
}